

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::torrent::bytes_done(torrent *this,torrent_status *st,status_flags_t flags)

{
  piece_index_t index;
  uint uVar1;
  uint uVar2;
  element_type *fs;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_00;
  bool bVar3;
  download_priority_t dVar4;
  int iVar5;
  int64_t iVar6;
  uint uVar7;
  long lVar8;
  pointer pdVar9;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  dl_queue;
  pointer local_48;
  pointer local_40;
  
  st->total_done = 0;
  st->total_wanted_done = 0;
  iVar6 = (this->super_torrent_hot_members).m_size_on_disk;
  st->total_wanted = iVar6;
  fs = (this->super_torrent_hot_members).m_torrent_file.
       super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((fs->m_files).m_piece_length < 1) {
    return;
  }
  if (((this->field_0x5cc & 4) != 0) || (bVar3 = is_seed(this), bVar3)) {
    st->total_done = (fs->m_files).m_total_size - this->m_padding_bytes;
    st->total_wanted_done = iVar6;
  }
  else {
    this_00._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_00._M_head_impl != (piece_picker *)0x0) {
      piece_picker::want((piece_count *)&local_48,this_00._M_head_impl);
      iVar6 = calc_bytes(&fs->m_files,(piece_count *)&local_48);
      lVar8 = (this->super_torrent_hot_members).m_size_on_disk;
      if (iVar6 < lVar8) {
        lVar8 = iVar6;
      }
      st->total_wanted = lVar8;
      lVar8 = (this->m_file_progress).m_total_on_disk;
      piece_picker::have_want
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      iVar6 = calc_bytes(&fs->m_files,(piece_count *)&local_48);
      if (iVar6 < lVar8) {
        lVar8 = iVar6;
      }
      st->total_wanted_done = lVar8;
      piece_picker::have((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                        );
      iVar6 = calc_bytes(&fs->m_files,(piece_count *)&local_48);
      st->total_done = iVar6;
      piece_picker::all_pieces
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      iVar6 = calc_bytes(&fs->m_files,(piece_count *)&local_48);
      st->total = iVar6;
      if ((flags.m_val & 2) == 0) {
        return;
      }
      piece_picker::get_download_queue
                ((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                  *)&local_48,
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      for (pdVar9 = local_48; pdVar9 != local_40; pdVar9 = pdVar9 + 1) {
        index.m_val = (pdVar9->index).m_val;
        bVar3 = piece_picker::have_piece
                          ((this->super_torrent_hot_members).m_picker._M_t.
                           super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                           .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                           _M_head_impl,index);
        if (!bVar3) {
          uVar1 = *(uint *)&pdVar9->field_0x6;
          iVar5 = piece_picker::pad_bytes_in_piece
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,index);
          uVar2 = (((this->super_torrent_hot_members).m_torrent_file.
                    super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->m_files).m_piece_length;
          uVar7 = 0x4000;
          if (uVar2 < 0x4000) {
            uVar7 = uVar2;
          }
          if ((int)uVar2 < 1) {
            uVar7 = 0x4000;
          }
          lVar8 = (ulong)uVar7 *
                  (long)(int)(((uVar1 >> 0x10 & 0x7fff) + (uVar1 & 0x7fff)) - iVar5 / (int)uVar7);
          st->total_done = st->total_done + lVar8;
          dVar4 = piece_picker::piece_priority
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,index);
          if (dVar4.m_val != '\0') {
            st->total_wanted_done = st->total_wanted_done + lVar8;
          }
        }
      }
      ::std::
      _Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
      ::~_Vector_base((_Vector_base<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                       *)&local_48);
      return;
    }
    st->total_done = 0;
    st->total_wanted_done = 0;
  }
  st->total_wanted = iVar6;
  return;
}

Assistant:

void torrent::bytes_done(torrent_status& st, status_flags_t const flags) const
	{
		INVARIANT_CHECK;

		st.total_done = 0;
		st.total_wanted_done = 0;
		st.total_wanted = m_size_on_disk;

		TORRENT_ASSERT(st.total_wanted <= m_torrent_file->total_size());
		TORRENT_ASSERT(st.total_wanted >= 0);

		TORRENT_ASSERT(!valid_metadata() || m_torrent_file->num_pieces() > 0);
		if (!valid_metadata()) return;

		if (m_seed_mode || is_seed())
		{
			// once we're a seed and remove the piece picker, we stop tracking
			// piece- and file priority. We consider everything as being
			// "wanted"
			st.total_done = m_torrent_file->total_size() - m_padding_bytes;
			st.total_wanted_done = m_size_on_disk;
			st.total_wanted = m_size_on_disk;
			TORRENT_ASSERT(st.total_wanted <= st.total_done);
			TORRENT_ASSERT(st.total_wanted_done <= st.total_wanted);
			TORRENT_ASSERT(st.total_done <= m_torrent_file->total_size());
			return;
		}
		else if (!has_picker())
		{
			st.total_done = 0;
			st.total_wanted_done = 0;
			st.total_wanted = m_size_on_disk;
			return;
		}

		TORRENT_ASSERT(has_picker());

		file_storage const& files = m_torrent_file->files();

		st.total_wanted = std::min(m_size_on_disk, calc_bytes(files, m_picker->want()));
		st.total_wanted_done = std::min(m_file_progress.total_on_disk()
			, calc_bytes(files, m_picker->have_want()));
		st.total_done = calc_bytes(files, m_picker->have());
		st.total = calc_bytes(files, m_picker->all_pieces());

		TORRENT_ASSERT(st.total_done <= calc_bytes(files, m_picker->all_pieces()));
		TORRENT_ASSERT(st.total_wanted <= calc_bytes(files, m_picker->all_pieces()));

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_wanted >= 0);
		TORRENT_ASSERT(st.total_wanted >= st.total_wanted_done);
		TORRENT_ASSERT(st.total_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);

		// this is expensive, we might not want to do it all the time
		if (!(flags & torrent_handle::query_accurate_download_counters)) return;

		// to get higher accuracy of the download progress, include
		// blocks from currently downloading pieces as well
		std::vector<piece_picker::downloading_piece> const dl_queue
			= m_picker->get_download_queue();

		// look at all unfinished pieces and add the completed
		// blocks to our 'done' counter
		for (auto i = dl_queue.begin(); i != dl_queue.end(); ++i)
		{
			piece_index_t const index = i->index;

			// completed pieces are already accounted for
			if (m_picker->have_piece(index)) continue;

			TORRENT_ASSERT(i->finished + i->writing <= m_picker->blocks_in_piece(index));

			auto const additional_bytes = std::int64_t(i->finished + i->writing
				- m_picker->pad_bytes_in_piece(index) / block_size())
				* block_size();
			TORRENT_ASSERT(additional_bytes >= 0);
			st.total_done += additional_bytes;
			if (m_picker->piece_priority(index) > dont_download)
				st.total_wanted_done += additional_bytes;
		}

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);
	}